

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_qsbr_oom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fc4f::QSBROOMTest_Resume_Test::QSBROOMTest_Resume_Test
          (QSBROOMTest_Resume_Test *this)

{
  QSBROOMTest_Resume_Test *this_local;
  
  unodb::test::QSBRTestBase::QSBRTestBase(&this->super_QSBROOMTest);
  (this->super_QSBROOMTest).super_Test._vptr_Test =
       (_func_int **)&PTR__QSBROOMTest_Resume_Test_001bd7c0;
  return;
}

Assistant:

UNODB_TEST_F(QSBROOMTest, Resume) {
  qsbr_pause();
  UNODB_ASSERT_EQ(get_qsbr_thread_count(), 0);
  oom_test(
      3, [] { unodb::this_thread().qsbr_resume(); },
      []() noexcept { UNODB_ASSERT_EQ(get_qsbr_thread_count(), 0); });
  UNODB_ASSERT_EQ(get_qsbr_thread_count(), 1);
}